

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *cp)

{
  long in_RCX;
  long *in_RSI;
  long *in_RDI;
  int n;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff68;
  TPZGeoMesh *in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  TPZGeoMesh *in_stack_ffffffffffffff80;
  TPZTriangleTorus *in_stack_ffffffffffffff88;
  TPZTriangleTorus *in_stack_ffffffffffffff90;
  long *local_58;
  int local_30;
  
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[3];
  pzgeom::TPZTriangleTorus::TPZTriangleTorus
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_58 = in_RDI + 0x3b;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff70);
    local_58 = local_58 + 3;
  } while (local_58 != in_RDI + 0x50);
  for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_30 * 3 + 0x3b),
               (TPZGeoElSideIndex *)(in_RCX + 0x1d8 + (long)local_30 * 0x18));
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}